

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm.cpp
# Opt level: O0

int __thiscall ncnn::BatchNorm::forward_inplace(BatchNorm *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long *in_RSI;
  long lVar7;
  long in_RDI;
  int i_2;
  float b_1;
  float a_1;
  float *ptr_2;
  int q;
  int size;
  int c;
  int d;
  int h_1;
  int w_2;
  int j;
  float b;
  float a;
  float *ptr_1;
  int i_1;
  int h;
  int w_1;
  int i;
  float *ptr;
  int w;
  int dims;
  Mat *m;
  int local_210;
  int local_1a4;
  int local_18c;
  int local_178;
  int local_16c;
  
  iVar4 = (int)in_RSI[5];
  if (iVar4 == 1) {
    iVar3 = *(int *)((long)in_RSI + 0x2c);
    lVar5 = *in_RSI;
    for (local_16c = 0; local_16c < iVar3; local_16c = local_16c + 1) {
      *(float *)(lVar5 + (long)local_16c * 4) =
           *(float *)(*(long *)(in_RDI + 0x240) + (long)local_16c * 4) *
           *(float *)(lVar5 + (long)local_16c * 4) +
           *(float *)(*(long *)(in_RDI + 0x1f8) + (long)local_16c * 4);
    }
  }
  if (iVar4 == 2) {
    iVar3 = *(int *)((long)in_RSI + 0x2c);
    lVar5 = in_RSI[6];
    for (local_178 = 0; local_178 < (int)lVar5; local_178 = local_178 + 1) {
      lVar6 = *in_RSI + (long)*(int *)((long)in_RSI + 0x2c) * (long)local_178 * in_RSI[2];
      fVar1 = *(float *)(*(long *)(in_RDI + 0x1f8) + (long)local_178 * 4);
      fVar2 = *(float *)(*(long *)(in_RDI + 0x240) + (long)local_178 * 4);
      for (local_18c = 0; local_18c < iVar3; local_18c = local_18c + 1) {
        *(float *)(lVar6 + (long)local_18c * 4) =
             fVar2 * *(float *)(lVar6 + (long)local_18c * 4) + fVar1;
      }
    }
  }
  if ((iVar4 == 3) || (iVar4 == 4)) {
    iVar4 = *(int *)((long)in_RSI + 0x2c);
    lVar5 = in_RSI[6];
    iVar3 = *(int *)((long)in_RSI + 0x34);
    lVar6 = in_RSI[7];
    for (local_1a4 = 0; local_1a4 < (int)lVar6; local_1a4 = local_1a4 + 1) {
      lVar7 = *in_RSI + in_RSI[8] * (long)local_1a4 * in_RSI[2];
      fVar1 = *(float *)(*(long *)(in_RDI + 0x1f8) + (long)local_1a4 * 4);
      fVar2 = *(float *)(*(long *)(in_RDI + 0x240) + (long)local_1a4 * 4);
      for (local_210 = 0; local_210 < iVar4 * (int)lVar5 * iVar3; local_210 = local_210 + 1) {
        *(float *)(lVar7 + (long)local_210 * 4) =
             fVar2 * *(float *)(lVar7 + (long)local_210 * 4) + fVar1;
      }
    }
  }
  return 0;
}

Assistant:

int BatchNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // a = bias - slope * mean / sqrt(var)
    // b = slope / sqrt(var)
    // value = b * value + a

    int dims = bottom_top_blob.dims;

    if (dims == 1)
    {
        int w = bottom_top_blob.w;

        float* ptr = bottom_top_blob;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < w; i++)
        {
            ptr[i] = b_data[i] * ptr[i] + a_data[i];
        }
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float a = a_data[i];
            float b = b_data[i];

            for (int j = 0; j < w; j++)
            {
                ptr[j] = b * ptr[j] + a;
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int d = bottom_top_blob.d;
        int c = bottom_top_blob.c;
        int size = w * h * d;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float a = a_data[q];
            float b = b_data[q];

            for (int i = 0; i < size; i++)
            {
                ptr[i] = b * ptr[i] + a;
            }
        }
    }

    return 0;
}